

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Server.cpp
# Opt level: O1

void __thiscall Server::Start(Server *this)

{
  iterator __position;
  int __fd;
  int iVar1;
  ostream *poVar2;
  undefined1 local_70 [8];
  sockaddr_in serv_addr;
  undefined4 local_4c;
  sockaddr *psStack_48;
  int on;
  vector<NetworkNode,_std::allocator<NetworkNode>_> *local_40;
  uint local_34 [2];
  socklen_t addrlenl;
  
  __fd = socket(2,1,0);
  local_4c = 1;
  setsockopt(__fd,1,2,&local_4c,4);
  setsockopt(__fd,6,1,&local_4c,4);
  local_4c = 0xc00000;
  setsockopt(__fd,1,7,&local_4c,4);
  setsockopt(__fd,1,8,&local_4c,4);
  if (__fd < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"ERROR opening socket",0x14);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x30);
    std::ostream::put(-0x30);
    std::ostream::flush();
  }
  bzero((sockaddr *)local_70,0x10);
  iVar1 = atoi(diplo::server_port_abi_cxx11_);
  local_70._0_2_ = 2;
  local_70[4] = '\0';
  local_70[5] = '\0';
  local_70[6] = '\0';
  local_70[7] = '\0';
  local_70._2_2_ = (ushort)iVar1 << 8 | (ushort)iVar1 >> 8;
  iVar1 = bind(__fd,(sockaddr *)local_70,0x10);
  if (iVar1 < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"ERROR on binding",0x10);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x30);
    std::ostream::put(-0x30);
    std::ostream::flush();
  }
  listen(__fd,0x14);
  psStack_48 = (sockaddr *)malloc((ulong)local_34[0]);
  local_40 = &this->nodes;
  do {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"waiting for next client",0x17);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x30);
    std::ostream::put(-0x30);
    std::ostream::flush();
    iVar1 = accept(__fd,psStack_48,local_34);
    if (iVar1 < 0) {
      poVar2 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      poVar2 = std::operator<<(poVar2,"ERROR in ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/MarcinWylot[P]tripleprov_demo/src/Server.cpp"
                              );
      poVar2 = std::operator<<(poVar2," at line ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x46);
      std::endl<char,std::char_traits<char>>(poVar2);
      exit(1);
    }
    serv_addr.sin_zero = (uchar  [8])&PTR__NetworkNode_00143c40;
    __position._M_current =
         (this->nodes).super__Vector_base<NetworkNode,_std::allocator<NetworkNode>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->nodes).super__Vector_base<NetworkNode,_std::allocator<NetworkNode>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<NetworkNode,_std::allocator<NetworkNode>_>::_M_realloc_insert<NetworkNode>
                (local_40,__position,(NetworkNode *)serv_addr.sin_zero);
    }
    else {
      (__position._M_current)->_vptr_NetworkNode = (_func_int **)&PTR__NetworkNode_00143c40;
      (__position._M_current)->fd = iVar1;
      (this->nodes).super__Vector_base<NetworkNode,_std::allocator<NetworkNode>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"connected: ",0xb);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  } while ((long)(this->nodes).super__Vector_base<NetworkNode,_std::allocator<NetworkNode>_>._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)(this->nodes).super__Vector_base<NetworkNode,_std::allocator<NetworkNode>_>._M_impl
                 .super__Vector_impl_data._M_start >> 4 != (ulong)diplo::nbOfClients);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"All clients connected",0x15);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x30);
  std::ostream::put(-0x30);
  std::ostream::flush();
  return;
}

Assistant:

void Server::Start() {
	int sockfd, portno;
	struct sockaddr_in serv_addr;

	sockfd = socket(AF_INET, SOCK_STREAM, 0);
	int on = 1;
	setsockopt(sockfd, SOL_SOCKET, SO_REUSEADDR, &on, sizeof(on));
	setsockopt(sockfd, IPPROTO_TCP, TCP_NODELAY, (char *) &on, sizeof(on));

	on = 12582912;
	setsockopt(sockfd, SOL_SOCKET, SO_SNDBUF, (char *) &on, sizeof(on));
	setsockopt(sockfd, SOL_SOCKET, SO_RCVBUF, (char *) &on, sizeof(on));

	if (sockfd < 0)
		cerr << "ERROR opening socket" << endl;
	bzero((char *) &serv_addr, sizeof(serv_addr));
	portno = atoi(diplo::server_port.c_str());
	serv_addr.sin_family = AF_INET;
	serv_addr.sin_addr.s_addr = INADDR_ANY;
	serv_addr.sin_port = htons(portno);
	if (bind(sockfd, (struct sockaddr *) &serv_addr, sizeof(serv_addr)) < 0)
		cerr << "ERROR on binding" << endl;
	listen(sockfd, 20);

	socklen_t addrlenl;
	struct sockaddr *addr = (struct sockaddr *) malloc(addrlenl);

	while (1) {
		cerr << "waiting for next client" << endl;
		int descriptor = accept(sockfd, addr, &addrlenl);
		if (descriptor < 0) {
			ERROR_OUT
			exit(1);
		}

		nodes.push_back(NetworkNode(descriptor));
		cout << "connected: " << nodes.size() << endl;
		if (nodes.size() == diplo::nbOfClients) {
			cerr << "All clients connected" << endl;
			return; //FIXME, this is not right way
		}
	}

}